

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateDSTests.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::anon_unknown_0::StencilParamsBasicTestCase::initPrograms
          (StencilParamsBasicTestCase *this,SourceCollections *programCollection)

{
  SourceCollections *this_00;
  ProgramSources *pPVar1;
  ShaderSourceProvider *pSVar2;
  char *in_RCX;
  string local_108;
  ShaderSource local_e8;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  ShaderSource local_78;
  allocator<char> local_39;
  string local_38;
  SourceCollections *local_18;
  SourceCollections *programCollection_local;
  StencilParamsBasicTestCase *this_local;
  
  local_18 = programCollection;
  programCollection_local = (SourceCollections *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"VertexFetch.vert",&local_39);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_38);
  pSVar2 = (ShaderSourceProvider *)
           tcu::TestContext::getArchive
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  ShaderSourceProvider::getSource_abi_cxx11_
            (&local_98,pSVar2,(Archive *)"vulkan/dynamic_state/VertexFetch.vert",in_RCX);
  glu::VertexSource::VertexSource((VertexSource *)&local_78,&local_98);
  glu::ProgramSources::operator<<(pPVar1,&local_78);
  glu::VertexSource::~VertexSource((VertexSource *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"VertexFetch.frag",&local_b9);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_b8);
  pSVar2 = (ShaderSourceProvider *)
           tcu::TestContext::getArchive
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  ShaderSourceProvider::getSource_abi_cxx11_
            (&local_108,pSVar2,(Archive *)"vulkan/dynamic_state/VertexFetch.frag",in_RCX);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_e8,&local_108);
  glu::ProgramSources::operator<<(pPVar1,&local_e8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  return;
}

Assistant:

virtual void initPrograms(vk::SourceCollections& programCollection) const
	{
		programCollection.glslSources.add("VertexFetch.vert") <<
			glu::VertexSource(ShaderSourceProvider::getSource(m_testCtx.getArchive(), "vulkan/dynamic_state/VertexFetch.vert"));

		programCollection.glslSources.add("VertexFetch.frag") <<
			glu::FragmentSource(ShaderSourceProvider::getSource(m_testCtx.getArchive(), "vulkan/dynamic_state/VertexFetch.frag"));
	}